

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa.c
# Opt level: O0

mraa_result_t mraa_atoi(char *intStr,int *value)

{
  long lVar1;
  int *piVar2;
  long val;
  char *end;
  int *value_local;
  char *intStr_local;
  
  end = (char *)value;
  value_local = (int *)intStr;
  lVar1 = strtol(intStr,(char **)&val,10);
  if ((((*(char *)val == '\0') && (piVar2 = __errno_location(), *piVar2 != 0x22)) &&
      ((int *)val != value_local)) && ((lVar1 < 0x80000000 && (-0x80000001 < lVar1)))) {
    *(int *)end = (int)lVar1;
    return MRAA_SUCCESS;
  }
  end[0] = '\0';
  end[1] = '\0';
  end[2] = '\0';
  end[3] = '\0';
  return MRAA_ERROR_UNSPECIFIED;
}

Assistant:

mraa_result_t
mraa_atoi(char* intStr, int* value)
{
    char* end;
    // here 10 determines the number base in which strol is to work
    long val = strtol(intStr, &end, 10);
    if (*end != '\0' || errno == ERANGE || end == intStr || val > INT_MAX || val < INT_MIN) {
        *value = 0;
        return MRAA_ERROR_UNSPECIFIED;
    }
    *value = (int) val;
    return MRAA_SUCCESS;
}